

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterRenameColumn(Parse *pParse,SrcList *pSrc,Token *pOld,Token *pNew)

{
  byte bVar1;
  sqlite3 *db_00;
  char *zArg1;
  int iVar2;
  int iVar3;
  Table *pTab_00;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar4;
  char *pcVar5;
  int bQuote;
  int iSchema;
  char *zDb;
  char *zNew;
  char *zOld;
  int iCol;
  Table *pTab;
  sqlite3 *db;
  Token *pNew_local;
  Token *pOld_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  zNew = (char *)0x0;
  zDb = (char *)0x0;
  pTab_00 = sqlite3LocateTableItem(pParse,0,pSrc->a);
  if (((pTab_00 != (Table *)0x0) && (iVar2 = isAlterableTable(pParse,pTab_00), iVar2 == 0)) &&
     (iVar2 = isRealTable(pParse,pTab_00), iVar2 == 0)) {
    iVar2 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
    zArg1 = db_00->aDb[iVar2].zDbSName;
    iVar3 = sqlite3AuthCheck(pParse,0x1a,zArg1,pTab_00->zName,(char *)0x0);
    if ((iVar3 == 0) && (zNew = sqlite3NameFromToken(db_00,pOld), zNew != (char *)0x0)) {
      for (zOld._4_4_ = 0; uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20),
          (int)zOld._4_4_ < (int)pTab_00->nCol; zOld._4_4_ = zOld._4_4_ + 1) {
        iVar3 = sqlite3StrICmp(pTab_00->aCol[(int)zOld._4_4_].zName,zNew);
        uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        if (iVar3 == 0) break;
      }
      if (zOld._4_4_ == (int)pTab_00->nCol) {
        sqlite3ErrorMsg(pParse,"no such column: \"%s\"",zNew);
      }
      else {
        sqlite3MayAbort(pParse);
        zDb = sqlite3NameFromToken(db_00,pNew);
        if (zDb != (char *)0x0) {
          bVar1 = ""[(byte)*pNew->z];
          pcVar5 = zDb;
          sqlite3NestedParse(pParse,
                             "UPDATE \"%w\".%s SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) WHERE name NOT LIKE \'sqlite_%%\' AND (type != \'index\' OR tbl_name = %Q) AND sql NOT LIKE \'create virtual%%\'"
                             ,zArg1,"sqlite_master",zArg1,pTab_00->zName,CONCAT44(uVar4,zOld._4_4_),
                             zDb,bVar1 & 0x80,(uint)(iVar2 == 1),pTab_00->zName);
          sqlite3NestedParse(pParse,
                             "UPDATE temp.%s SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) WHERE type IN (\'trigger\', \'view\')"
                             ,"sqlite_master",zArg1,pTab_00->zName,(ulong)zOld._4_4_,zDb,
                             CONCAT44((int)((ulong)pcVar5 >> 0x20),(uint)bVar1) & 0xffffffff00000080
                            );
          renameReloadSchema(pParse,iVar2);
          renameTestSchema(pParse,zArg1,(uint)(iVar2 == 1));
        }
      }
    }
  }
  sqlite3SrcListDelete(db_00,pSrc);
  sqlite3DbFree(db_00,zNew);
  sqlite3DbFree(db_00,zDb);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameColumn(
  Parse *pParse,                  /* Parsing context */
  SrcList *pSrc,                  /* Table being altered.  pSrc->nSrc==1 */
  Token *pOld,                    /* Name of column being changed */
  Token *pNew                     /* New column name */
){
  sqlite3 *db = pParse->db;       /* Database connection */
  Table *pTab;                    /* Table being updated */
  int iCol;                       /* Index of column being renamed */
  char *zOld = 0;                 /* Old column name */
  char *zNew = 0;                 /* New column name */
  const char *zDb;                /* Name of schema containing the table */
  int iSchema;                    /* Index of the schema */
  int bQuote;                     /* True to quote the new name */

  /* Locate the table to be altered */
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_column;

  /* Cannot alter a system table */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_rename_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab) ) goto exit_rename_column;

  /* Which schema holds the table to be altered */  
  iSchema = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iSchema>=0 );
  zDb = db->aDb[iSchema].zDbSName;

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_column;
  }
#endif

  /* Make sure the old name really is a column name in the table to be
  ** altered.  Set iCol to be the index of the column being renamed */
  zOld = sqlite3NameFromToken(db, pOld);
  if( !zOld ) goto exit_rename_column;
  for(iCol=0; iCol<pTab->nCol; iCol++){
    if( 0==sqlite3StrICmp(pTab->aCol[iCol].zName, zOld) ) break;
  }
  if( iCol==pTab->nCol ){
    sqlite3ErrorMsg(pParse, "no such column: \"%s\"", zOld);
    goto exit_rename_column;
  }

  /* Do the rename operation using a recursive UPDATE statement that
  ** uses the sqlite_rename_column() SQL function to compute the new
  ** CREATE statement text for the sqlite_master table.
  */
  sqlite3MayAbort(pParse);
  zNew = sqlite3NameFromToken(db, pNew);
  if( !zNew ) goto exit_rename_column;
  assert( pNew->n>0 );
  bQuote = sqlite3Isquote(pNew->z[0]);
  sqlite3NestedParse(pParse, 
      "UPDATE \"%w\".%s SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) "
      "WHERE name NOT LIKE 'sqlite_%%' AND (type != 'index' OR tbl_name = %Q)"
      " AND sql NOT LIKE 'create virtual%%'",
      zDb, MASTER_NAME, 
      zDb, pTab->zName, iCol, zNew, bQuote, iSchema==1,
      pTab->zName
  );

  sqlite3NestedParse(pParse, 
      "UPDATE temp.%s SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) "
      "WHERE type IN ('trigger', 'view')",
      MASTER_NAME, 
      zDb, pTab->zName, iCol, zNew, bQuote
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iSchema);
  renameTestSchema(pParse, zDb, iSchema==1);

 exit_rename_column:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zOld);
  sqlite3DbFree(db, zNew);
  return;
}